

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O2

Iterator __thiscall
HashSet<TestHashSetDestructor>::find
          (HashSet<TestHashSetDestructor> *this,TestHashSetDestructor *key)

{
  Item *pIVar1;
  Item **ppIVar2;
  
  if (this->data != (Item **)0x0) {
    ppIVar2 = this->data + (ulong)(long)key->num % this->capacity;
    while (pIVar1 = *ppIVar2, pIVar1 != (Item *)0x0) {
      if ((pIVar1->key).num == key->num) {
        return (Iterator)pIVar1;
      }
      ppIVar2 = &pIVar1->nextCell;
    }
  }
  return (Iterator)(this->_end).item;
}

Assistant:

Iterator find(const T& key) const
  {
    if(!data) return _end;
    usize hashCode = hash(key);
    Item* item = data[hashCode % capacity];
    while(item)
    {
      if(item->key == key) return item;
      item = item->nextCell;
    }
    return _end;
  }